

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedNormalizer.cpp
# Opt level: O1

bool __thiscall Shell::InterpretedNormalizer::apply(InterpretedNormalizer *this,UnitList **units)

{
  Clause *cl_00;
  Clause *pCVar1;
  List<Kernel::Unit_*> **ppLVar2;
  bool bVar3;
  List<Kernel::Unit_*> **ppLVar4;
  Clause *cl;
  bool bVar5;
  DelIterator uit;
  FTFormulaUnitTransformer<Shell::InterpretedNormalizer::NFormulaTransformer> futransf;
  NFormulaTransformer ftransf;
  DelIterator local_68;
  LocalFormulaUnitTransformer local_50;
  undefined ***local_40;
  undefined **local_38;
  NLiteralTransformer *local_30;
  
  local_30 = this->_litTransf;
  local_40 = &local_38;
  local_38 = &PTR_transform_00b6dde0;
  local_50._rule = THEORY_NORMALIZATION;
  local_50.super_FormulaUnitTransformer._vptr_FormulaUnitTransformer =
       (_func_int **)&PTR__FormulaUnitTransformer_00b6df68;
  local_68._prev = (UnitList *)0x0;
  local_68._cur = (UnitList *)0x0;
  ppLVar2 = (List<Kernel::Unit_*> **)&DAT_00000008;
  bVar5 = true;
  if (*units == (UnitList *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = false;
    local_68._lst = units;
    do {
      ppLVar4 = local_68._lst;
      if (!bVar5) {
        ppLVar4 = ppLVar2;
        local_68._prev = local_68._cur;
      }
      local_68._cur = *ppLVar4;
      cl_00 = (Clause *)(local_68._cur)->_head;
      if (((cl_00->super_Unit).field_0x4 & 1) == 0) {
        pCVar1 = apply(this,cl_00);
        if (cl_00 != pCVar1) {
          if (pCVar1 != (Clause *)0x0) goto LAB_00706c28;
          ::Lib::List<Kernel::Unit_*>::DelIterator::del(&local_68);
LAB_00706c30:
          bVar3 = true;
        }
      }
      else {
        pCVar1 = (Clause *)
                 Kernel::LocalFormulaUnitTransformer::transform(&local_50,(FormulaUnit *)cl_00);
        if (cl_00 != pCVar1) {
LAB_00706c28:
          (local_68._cur)->_head = &pCVar1->super_Unit;
          goto LAB_00706c30;
        }
      }
      ppLVar2 = &(local_68._cur)->_tail;
      bVar5 = local_68._cur == (UnitList *)0x0;
      ppLVar4 = ppLVar2;
      if (bVar5) {
        ppLVar4 = local_68._lst;
      }
    } while (*ppLVar4 != (UnitList *)0x0);
  }
  return bVar3;
}

Assistant:

bool InterpretedNormalizer::apply(UnitList*& units)
{
  NFormulaTransformer ftransf(_litTransf);
  FTFormulaUnitTransformer<NFormulaTransformer> futransf(InferenceRule::THEORY_NORMALIZATION, ftransf);

  bool modified = false;

  UnitList::DelIterator uit(units);
  while(uit.hasNext()) {
    Unit* u = uit.next();
    if(u->isClause()) {
      Clause* cl = static_cast<Clause*>(u);
      Clause* cl1 = apply(cl);
      if(cl!=cl1) {
	if(cl1) {
	  uit.replace(cl1);
	}
	else {
	  uit.del();
	}
	modified = true;
      }
    }
    else {
      FormulaUnit* fu = static_cast<FormulaUnit*>(u);
      FormulaUnit* fu1 = futransf.transform(fu);
      if(fu!=fu1) {
	      uit.replace(fu1);
	      modified = true;
      }
    }
  }
  return modified;
}